

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

fp fmt::v7::detail::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  fp fVar2;
  
  iVar1 = ((int)((ulong)((long)(min_exponent + 0x3f) * 0x4d104d42 + 0xffffffff) >> 0x20) + 0x15b) /
          8;
  *pow10_exponent = iVar1 * 8 + -0x154;
  fVar2.e = (int)*(short *)(basic_data<void>::pow10_exponents + (long)iVar1 * 2 + 2);
  fVar2.f = *(undefined8 *)(basic_data<void>::pow10_significands + (long)iVar1 * 8 + 8);
  fVar2._12_4_ = 0;
  return fVar2;
}

Assistant:

inline fp get_cached_power(int min_exponent, int& pow10_exponent) {
  const int64_t one_over_log2_10 = 0x4d104d42;  // round(pow(2, 32) / log2(10))
  int index = static_cast<int>(
      ((min_exponent + fp::significand_size - 1) * one_over_log2_10 +
       ((int64_t(1) << 32) - 1))  // ceil
      >> 32                       // arithmetic shift
  );
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  return {data::pow10_significands[index], data::pow10_exponents[index]};
}